

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgrenderstate.cpp
# Opt level: O2

void __thiscall lunasvg::SVGRenderState::beginGroup(SVGRenderState *this,SVGBlendInfo *blendInfo)

{
  bool bVar1;
  Rect boundingBox;
  undefined1 local_38 [16];
  Rect local_28;
  
  bVar1 = SVGBlendInfo::requiresCompositing(blendInfo,this->m_mode);
  if (bVar1) {
    (*(this->m_element->super_SVGNode)._vptr_SVGNode[0xd])();
    local_28 = Transform::mapRect(&this->m_currentTransform,(Rect *)local_38);
    local_38 = (undefined1  [16])
               Canvas::extents((this->m_canvas).
                               super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    Rect::intersect(&local_28,(Rect *)local_38);
    Canvas::create((Canvas *)local_38,&local_28);
    std::__shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_canvas).super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2> *)local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  }
  else {
    Canvas::save((this->m_canvas).super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    if (blendInfo->m_clipper != (SVGClipPathElement *)0x0) {
      SVGClipPathElement::applyClipPath(blendInfo->m_clipper,this);
      return;
    }
  }
  return;
}

Assistant:

void SVGRenderState::beginGroup(const SVGBlendInfo& blendInfo)
{
    auto requiresCompositing = blendInfo.requiresCompositing(m_mode);
    if(requiresCompositing) {
        auto boundingBox = m_currentTransform.mapRect(m_element->paintBoundingBox());
        boundingBox.intersect(m_canvas->extents());
        m_canvas = Canvas::create(boundingBox);
    } else {
        m_canvas->save();
    }

    if(!requiresCompositing && blendInfo.clipper()) {
        blendInfo.clipper()->applyClipPath(*this);
    }
}